

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb_details::leaf_node<char,_false>_> * __thiscall
immutable::ref<immutable::rrb_details::leaf_node<char,false>>::operator=
          (ref<immutable::rrb_details::leaf_node<char,false>> *this,
          ref<immutable::rrb_details::internal_node<char,_false>_> *r)

{
  internal_node<char,_false> *piVar1;
  leaf_node<char,_false> *p_node;
  
  piVar1 = r->ptr;
  if (piVar1 != (internal_node<char,_false> *)0x0) {
    piVar1->_ref_count = piVar1->_ref_count + 1;
  }
  p_node = *(leaf_node<char,_false> **)this;
  *(internal_node<char,_false> **)this = piVar1;
  rrb_details::release<char>(p_node);
  return (ref<immutable::rrb_details::leaf_node<char,_false>_> *)this;
}

Assistant:

ref<T>& ref<T>::operator = (const ref<U>& r)
      {
      ref<T> temp(r);
      swap(temp);
      return *this;
      }